

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void arena_dalloc_small(tsdn_t *tsdn,void *ptr)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  ulong *puVar3;
  bin_t *bin;
  undefined8 *puVar4;
  undefined8 *puVar5;
  arena_t *arena;
  bin_t *pbVar6;
  ulong uVar7;
  undefined8 uVar8;
  pthread_mutex_t *__mutex;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  rtree_leaf_elm_t *prVar12;
  arena_tdata_t *paVar13;
  ulong uVar14;
  long lVar15;
  extent_t *slab;
  mutex_prof_data_t *data;
  rtree_ctx_t *ctx;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar11 = (ulong)ptr & 0xffffffffc0000000;
  uVar14 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar3 = (ulong *)((long)&ctx->cache[0].leafkey + uVar14);
  uVar14 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar14);
  if (uVar14 == uVar11) {
    prVar12 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar3[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar11) {
    prVar12 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar14;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
    *puVar3 = uVar11;
    puVar3[1] = (ulong)prVar12;
    prVar12 = (rtree_leaf_elm_t *)
              ((long)&(prVar12->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    lVar15 = 0x118;
    do {
      if (*(ulong *)((long)ctx->cache + lVar15 + -8) == uVar11) {
        uVar7 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar15);
        puVar4 = (undefined8 *)((long)ctx->cache + lVar15 + -0x18);
        uVar8 = puVar4[1];
        puVar5 = (undefined8 *)((long)ctx->cache + lVar15 + -8);
        *puVar5 = *puVar4;
        puVar5[1] = uVar8;
        *(ulong *)((long)ctx->cache + lVar15 + -0x18) = uVar14;
        *(ulong *)((long)(ctx->cache + -1) + lVar15) = puVar3[1];
        *puVar3 = uVar11;
        puVar3[1] = uVar7;
        prVar12 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar7);
        goto LAB_0010eab3;
      }
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x188);
    prVar12 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,ctx,(uintptr_t)ptr,true,false);
  }
LAB_0010eab3:
  slab = (extent_t *)(((long)(prVar12->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe);
  arena = (arena_t *)arenas[(uint)slab->e_bits & 0xfff].repr;
  uVar14 = slab->e_bits >> 0x12 & 0xff;
  uVar9 = (uint)(slab->e_bits >> 0x24) & 0x3f;
  pbVar6 = arena->bins[uVar14].bin_shards;
  bin = pbVar6 + uVar9;
  __mutex = (pthread_mutex_t *)((long)&pbVar6[uVar9].lock.field_0 + 0x40);
  iVar10 = pthread_mutex_trylock(__mutex);
  if (iVar10 != 0) {
    malloc_mutex_lock_slow(&bin->lock);
    (bin->lock).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((bin->lock).field_0.field_0.prof_data.prev_owner != tsdn) {
    (bin->lock).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  arena_dalloc_bin_locked_impl(tsdn,arena,bin,(szind_t)uVar14,slab,ptr,false);
  (bin->lock).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  if (tsdn != (tsdn_t *)0x0) {
    uVar9 = arena->base->ind;
    paVar13 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata;
    if ((paVar13 == (arena_tdata_t *)0x0) ||
       ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata <= uVar9)) {
      paVar13 = arena_tdata_get_hard(&tsdn->tsd,uVar9);
    }
    else {
      paVar13 = paVar13 + uVar9;
    }
    if ((paVar13 != (arena_tdata_t *)0x0) &&
       (iVar10 = (paVar13->decay_ticker).tick, (paVar13->decay_ticker).tick = iVar10 + -1,
       iVar10 < 1)) {
      (paVar13->decay_ticker).tick = (paVar13->decay_ticker).nticks;
      arena_decay(tsdn,arena,false,false);
    }
  }
  return;
}

Assistant:

void
arena_dalloc_small(tsdn_t *tsdn, void *ptr) {
	extent_t *extent = iealloc(tsdn, ptr);
	arena_t *arena = extent_arena_get(extent);

	arena_dalloc_bin(tsdn, arena, extent, ptr);
	arena_decay_tick(tsdn, arena);
}